

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O2

int hdr_encode_compressed(hdr_histogram *h,uint8_t **compressed_histogram,size_t *compressed_len)

{
  ulong uVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  undefined4 *puVar8;
  uint8_t *__ptr;
  long lVar9;
  long lVar10;
  undefined4 *__ptr_00;
  int iVar11;
  uint uVar12;
  uLongf dest_len;
  size_t *local_48;
  uint8_t **local_40;
  undefined4 *local_38;
  
  local_40 = compressed_histogram;
  iVar5 = counts_index_for(h,h->max_value);
  iVar7 = iVar5 + 1;
  if (h->counts_len <= iVar5 + 1) {
    iVar7 = h->counts_len;
  }
  puVar8 = (undefined4 *)calloc((long)iVar7 * 9 + 0x28,1);
  uVar12 = 0;
  __ptr_00 = puVar8;
  if (puVar8 != (undefined4 *)0x0) {
    iVar11 = 0;
    local_48 = compressed_len;
    local_38 = puVar8;
    while( true ) {
      __ptr_00 = local_38;
      iVar6 = iVar7 - iVar11;
      if (iVar6 == 0 || iVar7 < iVar11) break;
      lVar9 = (long)iVar11;
      lVar10 = h->counts[lVar9];
      if (lVar10 == 0) {
        for (lVar10 = 1; iVar4 = iVar7, lVar9 + lVar10 < (long)iVar7; lVar10 = lVar10 + 1) {
          if (h->counts[lVar9 + lVar10] != 0) {
            iVar6 = (int)lVar10;
            iVar4 = iVar11 + iVar6;
            break;
          }
        }
        iVar11 = iVar4;
        lVar10 = (long)-iVar6;
      }
      else {
        iVar11 = iVar11 + 1;
      }
      iVar6 = zig_zag_encode_i64((uint8_t *)((long)puVar8 + (long)(int)uVar12 + 0x28),lVar10);
      uVar12 = uVar12 + iVar6;
    }
    lVar10 = (long)(int)uVar12 + 0x28;
    *local_38 = 0x1393841c;
    local_38[1] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                  uVar12 << 0x18;
    uVar12 = h->normalizing_index_offset;
    local_38[2] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                  uVar12 << 0x18;
    uVar12 = h->significant_figures;
    local_38[3] = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                  uVar12 << 0x18;
    uVar1 = h->lowest_discernible_value;
    *(ulong *)(local_38 + 4) =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    uVar1 = h->highest_trackable_value;
    *(ulong *)(local_38 + 6) =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    dVar2 = h->conversion_ratio;
    *(ulong *)(local_38 + 8) =
         (ulong)dVar2 >> 0x38 | ((ulong)dVar2 & 0xff000000000000) >> 0x28 |
         ((ulong)dVar2 & 0xff0000000000) >> 0x18 | ((ulong)dVar2 & 0xff00000000) >> 8 |
         ((ulong)dVar2 & 0xff000000) << 8 | ((ulong)dVar2 & 0xff0000) << 0x18 |
         ((ulong)dVar2 & 0xff00) << 0x28 | (long)dVar2 << 0x38;
    dest_len = compressBound(lVar10);
    __ptr = (uint8_t *)malloc(dest_len + 8);
    if (__ptr != (uint8_t *)0x0) {
      iVar7 = compress(__ptr + 8,&dest_len,__ptr_00,lVar10);
      if (iVar7 == 0) {
        __ptr[0] = '\x1c';
        __ptr[1] = 0x84;
        __ptr[2] = 0x93;
        __ptr[3] = '\x14';
        uVar12 = (uint)dest_len;
        *(uint *)(__ptr + 4) =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        *local_40 = __ptr;
        *local_48 = dest_len + 8;
        bVar3 = false;
        iVar7 = 0;
      }
      else {
        iVar7 = -0x752c;
        bVar3 = true;
      }
      goto LAB_00104954;
    }
  }
  bVar3 = false;
  __ptr = (uint8_t *)0x0;
  iVar7 = 0xc;
LAB_00104954:
  free(__ptr_00);
  if (bVar3) {
    free(__ptr);
  }
  return iVar7;
}

Assistant:

int hdr_encode_compressed(
    struct hdr_histogram* h,
    uint8_t** compressed_histogram,
    size_t* compressed_len)
{
    encoding_flyweight_v1_t* encoded = NULL;
    compression_flyweight_t* compressed = NULL;
    int i;
    int result = 0;
    int data_index = 0;
    int32_t payload_len;
    uLong encoded_size;
    uLongf dest_len;
    size_t compressed_size;

    int32_t len_to_max = counts_index_for(h, h->max_value) + 1;
    int32_t counts_limit = len_to_max < h->counts_len ? len_to_max : h->counts_len;

    const size_t encoded_len = SIZEOF_ENCODING_FLYWEIGHT_V1 + MAX_BYTES_LEB128 * (size_t) counts_limit;
    if ((encoded = (encoding_flyweight_v1_t*) hdr_calloc(encoded_len, sizeof(uint8_t))) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    for (i = 0; i < counts_limit;)
    {
        int64_t value = h->counts[i];
        i++;

        if (value == 0)
        {
            int32_t zeros = 1;

            while (i < counts_limit && 0 == h->counts[i])
            {
                zeros++;
                i++;
            }

            data_index += zig_zag_encode_i64(&encoded->counts[data_index], -zeros);
        }
        else
        {
            data_index += zig_zag_encode_i64(&encoded->counts[data_index], value);
        }
    }

    payload_len = data_index;
    encoded_size = SIZEOF_ENCODING_FLYWEIGHT_V1 + data_index;

    encoded->cookie                   = htobe32(V2_ENCODING_COOKIE | 0x10U);
    encoded->payload_len              = htobe32(payload_len);
    encoded->normalizing_index_offset = htobe32(h->normalizing_index_offset);
    encoded->significant_figures      = htobe32(h->significant_figures);
    encoded->lowest_discernible_value   = htobe64(h->lowest_discernible_value);
    encoded->highest_trackable_value  = htobe64(h->highest_trackable_value);
    encoded->conversion_ratio_bits    = htobe64(double_to_int64_bits(h->conversion_ratio));


    /* Estimate the size of the compressed histogram. */
    dest_len = compressBound(encoded_size);
    compressed_size = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    if ((compressed = (compression_flyweight_t*) hdr_malloc(compressed_size)) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    if (Z_OK != compress(compressed->data, &dest_len, (Bytef*) encoded, encoded_size))
    {
        FAIL_AND_CLEANUP(cleanup, result, HDR_DEFLATE_FAIL);
    }

    compressed->cookie = htobe32(V2_COMPRESSION_COOKIE | 0x10U);
    compressed->length = htobe32((int32_t)dest_len);

    *compressed_histogram = (uint8_t*) compressed;
    *compressed_len = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    cleanup:
    hdr_free(encoded);
    if (result == HDR_DEFLATE_FAIL)
    {
        hdr_free(compressed);
    }

    return result;
}